

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O2

ssize_t __thiscall JSON::JSON_string::write(JSON_string *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  undefined4 in_register_00000034;
  allocator<char> local_91;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"\"",&local_91);
  Writer::encode_string(&local_90,&this->utf8);
  std::operator+(&local_50,&local_70,&local_90);
  std::operator+(&local_30,&local_50,"\"");
  Pipeline::operator<<((Pipeline *)CONCAT44(in_register_00000034,__fd),&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_90);
  sVar1 = std::__cxx11::string::~string((string *)&local_70);
  return sVar1;
}

Assistant:

void
JSON::JSON_string::write(Pipeline* p, size_t) const
{
    *p << std::string("\"") + Writer::encode_string(utf8) + "\"";
}